

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::setComment(Value *this,String *comment,CommentPlacement placement)

{
  ulong uVar1;
  char *pcVar2;
  String local_1e8;
  String local_1c8;
  ostringstream local_198 [8];
  OStringStream oss;
  CommentPlacement placement_local;
  String *comment_local;
  Value *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::back();
    if (*pcVar2 == '\n') {
      std::__cxx11::string::pop_back();
    }
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)comment);
    if (*pcVar2 != '/') {
      std::__cxx11::ostringstream::ostringstream(local_198);
      std::operator<<((ostream *)local_198,
                      "in Json::Value::setComment(): Comments must start with /");
      std::__cxx11::ostringstream::str();
      throwLogicError(&local_1c8);
    }
  }
  std::__cxx11::string::string((string *)&local_1e8,(string *)comment);
  Comments::set(&this->comments_,placement,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  return;
}

Assistant:

void Value::setComment(String comment, CommentPlacement placement) {
  if (!comment.empty() && (comment.back() == '\n')) {
    // Always discard trailing newline, to aid indentation.
    comment.pop_back();
  }
  JSON_ASSERT_MESSAGE(
      comment.empty() || comment[0] == '/',
      "in Json::Value::setComment(): Comments must start with /");
  comments_.set(placement, std::move(comment));
}